

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

double __thiscall
ParserProbModelXML::QueryADD
          (ParserProbModelXML *this,xmlNodePtr root_node,xmlNodePtr current_node,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          *t0_deps,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *t1_deps)

{
  _Rb_tree_color domainI;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *this_00;
  __type_conflict _Var1;
  bool bVar2;
  int iVar3;
  xmlNodePtr pxVar4;
  const_iterator cVar5;
  EParse *pEVar6;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar7;
  long lVar8;
  StateFactorDiscrete *this_01;
  ParserProbModelXML *pPVar9;
  _xmlNode *node;
  char *pcVar10;
  xmlXPathObjectPtr pxVar11;
  ParserProbModelXML *pPVar12;
  elm_type eVar13;
  ParserProbModelXML *pPVar14;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *p_Var15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  double local_390;
  string var_name;
  string xpath_str;
  string value_name;
  string top_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *local_2d8;
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [32];
  undefined1 local_290 [32];
  string local_270;
  undefined1 local_250 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_100;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_a0;
  undefined1 local_70 [64];
  undefined1 extraout_var [56];
  
  pPVar9 = (ParserProbModelXML *)local_250;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pPVar9,"TopVariable",(allocator<char> *)&top_name);
  pPVar12 = (ParserProbModelXML *)current_node;
  pxVar4 = FindChild(pPVar9,current_node,(string *)local_250);
  std::__cxx11::string::~string((string *)local_250);
  if (pxVar4 == (xmlNodePtr)0x0) {
    pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
    EParse::EParse(pEVar6,"Incorrectly specified Tree/ADD (no top variable).");
    __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
  }
  pPVar9 = (ParserProbModelXML *)&top_name;
  GetVariableName_abi_cxx11_((string *)pPVar9,pPVar12,pxVar4);
  iVar3 = GetVariableTimeslice(pPVar9,pxVar4);
  if (iVar3 == 0) {
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
            ::find(&t0_deps->_M_t,&top_name);
    if ((_Rb_tree_header *)cVar5._M_node == &(t0_deps->_M_t)._M_impl.super__Rb_tree_header) {
      pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
      std::operator+(&value_name,"Top variable ",&top_name);
      std::operator+(&local_150,&value_name," not present in dependencies.");
      EParse::EParse(pEVar6,&local_150);
      __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
    }
  }
  else {
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
            ::find(&t1_deps->_M_t,&top_name);
    if ((_Rb_tree_header *)cVar5._M_node == &(t1_deps->_M_t)._M_impl.super__Rb_tree_header) {
      pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
      std::operator+(&value_name,"Top variable ",&top_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1b0 + 0x40),&value_name," not present in dependencies.");
      EParse::EParse(pEVar6,(string *)(local_1b0 + 0x40));
      __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
    }
  }
  domainI = cVar5._M_node[2]._M_color;
  std::__cxx11::string::string((string *)(local_290 + 0x20),(string *)&top_name);
  local_2d8 = &t0_deps->_M_t;
  pVar7 = GetParsedElement(this,(string *)(local_290 + 0x20));
  uVar16 = (ulong)pVar7 >> 0x20;
  std::__cxx11::string::~string((string *)(local_290 + 0x20));
  value_name._M_dataplus._M_p = (pointer)&value_name.field_2;
  value_name._M_string_length = 0;
  value_name.field_2._M_local_buf[0] = '\0';
  eVar13 = pVar7.first;
  if (eVar13 == STATE) {
    this_01 = (StateFactorDiscrete *)
              (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                     super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 200))
                        (this->_m_fDecPOMDP,uVar16);
    StateFactorDiscrete::GetStateFactorValue_abi_cxx11_(&var_name,this_01,domainI);
  }
  else if (eVar13 == ACTION) {
    if (this->_m_asynchronousModel != false) {
      std::__cxx11::string::_M_assign((string *)&value_name);
      goto LAB_0049ee41;
    }
    lVar8 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                   super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 0x120))
                      (this->_m_fDecPOMDP,uVar16,domainI);
    std::__cxx11::string::string((string *)&var_name,(string *)(lVar8 + 8));
  }
  else {
    if (eVar13 != OBSERVATION) {
      pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
      std::operator+(&var_name,"Variable ",&top_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1b0 + 0x20),&var_name," has unrecognized dependencies.");
      EParse::EParse(pEVar6,(string *)(local_1b0 + 0x20));
      __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
    }
    lVar8 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                   super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 0x178))
                      (this->_m_fDecPOMDP,uVar16,domainI);
    std::__cxx11::string::string((string *)&var_name,(string *)(lVar8 + 8));
  }
  std::__cxx11::string::operator=((string *)&value_name,(string *)&var_name);
  std::__cxx11::string::~string((string *)&var_name);
LAB_0049ee41:
  pPVar9 = (ParserProbModelXML *)local_290;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pPVar9,"Branches",(allocator<char> *)&var_name);
  pxVar4 = FindChild(pPVar9,current_node,(string *)local_290);
  std::__cxx11::string::~string((string *)local_290);
  if (pxVar4 == (xmlNodePtr)0x0) {
    pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
    EParse::EParse(pEVar6,"Incorrectly specified Tree/ADD (no branches).");
    __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
  }
  local_2e0 = &t1_deps->_M_t;
  pPVar9 = (ParserProbModelXML *)xmlFirstElementChild(pxVar4);
  bVar2 = false;
  do {
    if ((pPVar9 == (ParserProbModelXML *)0x0) || (bVar2)) {
      pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
      std::operator+(&var_name,"Probability under top variable ",&top_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_250 + 0x20),&var_name," not found.");
      EParse::EParse(pEVar6,(string *)(local_250 + 0x20));
      __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
    }
    if (*(int *)&pPVar9->_m_context == 1) {
      pPVar14 = (ParserProbModelXML *)local_1b0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"States",(allocator<char> *)&var_name);
      pPVar12 = pPVar9;
      pxVar4 = FindChild(pPVar14,(xmlNodePtr)pPVar9,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      lVar8 = xmlChildElementCount(pxVar4);
      if (lVar8 == 0) {
        bVar2 = true;
      }
      else {
        node = (_xmlNode *)xmlFirstElementChild(pxVar4);
        while ((node != (xmlNodePtr)0x0 && (!bVar2))) {
          if (node->type == XML_ELEMENT_NODE) {
            GetVariableName_abi_cxx11_(&var_name,pPVar12,node);
            pPVar12 = (ParserProbModelXML *)&var_name;
            _Var1 = std::operator==(&value_name,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&var_name);
            if (_Var1) {
              bVar2 = true;
            }
            std::__cxx11::string::~string((string *)&var_name);
          }
          node = node->next;
        }
        if (!bVar2) goto LAB_0049f067;
      }
      pPVar12 = (ParserProbModelXML *)(local_70 + 0x20);
      pPVar14 = pPVar12;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)pPVar12,"Reference",(allocator<char> *)&var_name);
      pxVar4 = FindChild(pPVar14,(xmlNodePtr)pPVar9,(string *)pPVar12);
      std::__cxx11::string::~string((string *)pPVar12);
      if (pxVar4 != (xmlNodePtr)0x0) {
        pcVar10 = (char *)xmlNodeListGetString(this->_m_doc,pxVar4->children,1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&var_name,pcVar10,(allocator<char> *)&xpath_str);
        std::operator+(&local_300,".//Branch/Label[contains(.,\'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &var_name);
        std::operator+(&xpath_str,&local_300,"\')]");
        std::__cxx11::string::~string((string *)&local_300);
        pxVar11 = GetNodesMatchingExpression(this,(xmlChar *)xpath_str._M_dataplus._M_p,root_node);
        if (pxVar11 == (xmlXPathObjectPtr)0x0) {
          pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
          std::operator+(&local_300,"Label \"",&var_name);
          std::operator+(&local_1d0,&local_300,"\" not found.");
          EParse::EParse(pEVar6,&local_1d0);
          __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
        }
        if (1 < pxVar11->nodesetval->nodeNr) {
          pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
          std::operator+(&local_300,"Label \"",&var_name);
          std::operator+(&local_1f0,&local_300,"\" defined multiple times.");
          EParse::EParse(pEVar6,&local_1f0);
          __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
        }
        pPVar9 = (ParserProbModelXML *)(*pxVar11->nodesetval->nodeTab)->parent;
        std::__cxx11::string::~string((string *)&xpath_str);
        std::__cxx11::string::~string((string *)&var_name);
      }
      pPVar12 = (ParserProbModelXML *)local_70;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_70,"Potential",(allocator<char> *)&var_name);
      pxVar4 = FindChild(pPVar12,(xmlNodePtr)pPVar9,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      if (pxVar4 != (xmlNodePtr)0x0) {
        pcVar10 = (char *)xmlGetProp(pxVar4,"type");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&var_name,pcVar10,(allocator<char> *)&xpath_str);
        this_00 = local_2d8;
        p_Var15 = local_2e0;
        bVar2 = std::operator==(&var_name,"Tree/ADD");
        if (bVar2) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::_Rb_tree(&local_a0,this_00);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::_Rb_tree(&local_d0,p_Var15);
          local_390 = QueryADD(this,root_node,pxVar4,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                *)&local_a0,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                *)&local_d0);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::~_Rb_tree(&local_d0);
          p_Var15 = &local_a0;
        }
        else {
          bVar2 = std::operator==(&var_name,"Table");
          if (!bVar2) {
            bVar2 = std::operator==(&var_name,"Uniform");
            if (!bVar2) {
              pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
              std::operator+(&xpath_str,"CPD type \"",&var_name);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_250 + 0x40),&xpath_str,"\" not supported.");
              EParse::EParse(pEVar6,(string *)(local_250 + 0x40));
              __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
            }
            pPVar9 = (ParserProbModelXML *)local_2b0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)pPVar9,"Variables",(allocator<char> *)&xpath_str);
            pPVar12 = (ParserProbModelXML *)FindChild(pPVar9,pxVar4,(string *)local_2b0);
            pPVar9 = (ParserProbModelXML *)local_2d0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)pPVar9,"Variable",(allocator<char> *)&local_300);
            pxVar4 = FindChild(pPVar9,(xmlNodePtr)pPVar12,(string *)local_2d0);
            std::__cxx11::string::~string((string *)local_2d0);
            auVar18._0_8_ = std::__cxx11::string::~string((string *)local_2b0);
            auVar18._8_56_ = extraout_var;
            auVar17 = auVar18._0_16_;
            pPVar9 = (ParserProbModelXML *)&xpath_str;
            GetVariableName_abi_cxx11_((string *)pPVar9,pPVar12,pxVar4);
            iVar3 = GetVariableTimeslice(pPVar9,pxVar4);
            if (iVar3 == 0) {
              cVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                      ::find(this_00,&xpath_str);
            }
            else {
              cVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                      ::find(p_Var15,&xpath_str);
            }
            auVar17 = vcvtusi2ss_avx512f(auVar17,*(undefined4 *)&cVar5._M_node[2].field_0x4);
            local_390 = 1.0 / (double)auVar17._0_4_;
            std::__cxx11::string::~string((string *)&xpath_str);
            goto LAB_0049f280;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::_Rb_tree(&local_100,this_00);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::_Rb_tree(&local_130,p_Var15);
          local_390 = QueryTable(this,pxVar4,
                                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                  *)&local_100,
                                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                  *)&local_130);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::~_Rb_tree(&local_130);
          p_Var15 = &local_100;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::~_Rb_tree(p_Var15);
LAB_0049f280:
        std::__cxx11::string::~string((string *)&var_name);
        std::__cxx11::string::~string((string *)&value_name);
        std::__cxx11::string::~string((string *)&top_name);
        return local_390;
      }
    }
LAB_0049f067:
    pPVar9 = (ParserProbModelXML *)
             (pPVar9->_m_parsedElements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  } while( true );
}

Assistant:

double ParserProbModelXML::QueryADD(const xmlNodePtr root_node,
                                    const xmlNodePtr current_node,
                                    const std::map<std::string, std::pair<Index, Index> > t0_deps, 
                                    const std::map<std::string, std::pair<Index, Index> > t1_deps)
{
    //find top variable
    xmlNodePtr top = FindChild(current_node, "TopVariable");
    if(top == NULL)
        throw EParse("Incorrectly specified Tree/ADD (no top variable).");
   
    string top_name = GetVariableName(top);
    int timeslice = GetVariableTimeslice(top);    
    
    map<string, pair<Index, Index> >::const_iterator it;
    if(timeslice == 0){ 
        it = t0_deps.find(top_name);
        if(it == t0_deps.end())
        {
            throw EParse("Top variable " + top_name + " not present in dependencies.");
        }
    }
    else
    {
        it = t1_deps.find(top_name);
        if(it == t1_deps.end())
        {
            throw EParse("Top variable " + top_name + " not present in dependencies.");
        }
    }

    Index value = it->second.first; //the (integer) value of the requested top variable
    std::pair<elm_type, Index> elm = GetParsedElement(top_name);
    string value_name;
    switch(elm.first)
    {
    case STATE:
        value_name = _m_fDecPOMDP->GetStateFactorDiscrete(elm.second)->GetStateFactorValue(value);
        break;
    case ACTION:
        if(!_m_asynchronousModel)
            value_name = _m_fDecPOMDP->GetAction(elm.second, value)->GetName();
        else
            value_name = _m_ANames[elm.second][value];
        break;
    case OBSERVATION:
        value_name = _m_fDecPOMDP->GetObservation(elm.second, value)->GetName();
        break;
    default:
        throw EParse("Variable " + top_name + " has unrecognized dependencies.");
        break;
    }
    xmlNodePtr branch_set = FindChild(current_node, "Branches");
    if(branch_set == NULL)
        throw EParse("Incorrectly specified Tree/ADD (no branches).");

    xmlNodePtr branch = xmlFirstElementChild(branch_set);
    bool found_branch = false;
    while(branch != NULL && !found_branch)
    {
        if(branch->type == XML_ELEMENT_NODE)
        {
            xmlNodePtr states = FindChild(branch, "States");
            if(xmlChildElementCount(states) == 0)
            {
                found_branch = true;
            }
            else
            {
                xmlNodePtr var_state = xmlFirstElementChild(states);
                while(var_state != NULL && !found_branch)
                {
                    if(var_state->type == XML_ELEMENT_NODE)
                    {
                        string var_name = GetVariableName(var_state);
                        if(value_name == var_name)
                        {
                            found_branch = true;
                        }
                    }
                    var_state = var_state->next;
                }
            }
            if(found_branch)
            {
                //Check if it is a reference to another branch
                xmlNodePtr reference = FindChild(branch, "Reference");
                if(reference != NULL)
                {
                    string ref_name((char*) xmlNodeListGetString(GetDoc(), reference->xmlChildrenNode, 1));
                    string xpath_str = ".//Branch/Label[contains(.,'"+ref_name+"')]";
                    xmlXPathObjectPtr label_nodes = GetNodesMatchingExpression((xmlChar*) xpath_str.c_str(),root_node);                    
                    if(label_nodes == NULL)
                    {
                        throw EParse("Label \"" + ref_name + "\" not found.");
                    }
                    else if(label_nodes->nodesetval->nodeNr > 1)
                    {
                        throw EParse("Label \"" + ref_name + "\" defined multiple times.");
                    }
                    branch = label_nodes->nodesetval->nodeTab[0]->parent;
                }
                
                xmlNodePtr potential = FindChild(branch, "Potential");
                if(potential != NULL)
                {
                    string CPD_type = (char*) xmlGetProp(potential, (xmlChar*) "type");
                    if(CPD_type == "Tree/ADD")
                    {
                        return QueryADD(root_node, potential, t0_deps, t1_deps);
                    }
                    else if(CPD_type == "Table")
                    {
                        return QueryTable(potential, t0_deps, t1_deps);
                    }
                    else if(CPD_type == "Uniform")
                    {
                        map<string, pair<Index, Index> >::const_iterator it;
                        xmlNodePtr dep_var = FindChild(FindChild(potential, "Variables"), "Variable");
                        string dep_var_name = GetVariableName(dep_var);
                        int dep_var_time = GetVariableTimeslice(dep_var);
                        if(dep_var_time == 0)
                        {
                            it = t0_deps.find(dep_var_name);
                        }
                        else
                        {
                            it = t1_deps.find(dep_var_name);
                        }
                        return 1.0/(float) it->second.second;
                    }
                    else
                    {
                        throw EParse("CPD type \"" + CPD_type + "\" not supported.");
                    }
                }
            }
        }
        branch = branch->next;
    }

    throw EParse("Probability under top variable " + top_name + " not found.");
}